

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O3

Color __thiscall nite::Color::operator*(Color *this,Color *v)

{
  float *in_RDX;
  undefined8 extraout_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  Color CVar1;
  
  this->r = v->r;
  this->g = v->g;
  this->b = v->b;
  this->a = v->a;
  rectify(this);
  this->r = *in_RDX * this->r;
  this->g = in_RDX[1] * this->g;
  this->b = in_RDX[2] * this->b;
  rectify(this);
  CVar1.b = (float)(int)in_XMM1_Qa;
  CVar1.a = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  CVar1.r = (float)(int)extraout_XMM0_Qa;
  CVar1.g = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return CVar1;
}

Assistant:

nite::Color nite::Color::operator*(const nite::Color &v){
	auto b = *this;
	b.r *= v.r;
	b.g *= v.g;
	b.b *= v.b;
	b.rectify();
	return b;
}